

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int as154(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
         double *var,double *resid,double *loglik,double *hess,int cssml)

{
  size_t __size;
  double *__ptr;
  double *__ptr_00;
  int iVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  reg_object obj;
  alik_object __ptr_01;
  int *ipiv;
  long lVar5;
  int N_00;
  ulong uVar6;
  ulong uVar7;
  int p_00;
  int iVar8;
  undefined4 in_register_00000084;
  long lVar9;
  double dVar10;
  undefined1 local_c0 [8];
  custom_function as154_min;
  int P;
  int Q;
  int local_98;
  int local_94;
  int p_local;
  int q_local;
  long local_88;
  long local_80;
  double *local_78;
  ulong local_70;
  double local_68;
  int local_5c;
  ulong local_58;
  double *local_50;
  ulong local_48;
  uint local_40;
  uint local_3c;
  double *local_38;
  
  _p_local = CONCAT44(in_register_00000084,d);
  uVar7 = (ulong)(uint)q;
  uVar6 = (ulong)(uint)p;
  local_5c = N - d;
  local_98 = p;
  local_94 = q;
  local_78 = (double *)malloc((long)local_5c << 3);
  iVar8 = (int)_p_local;
  local_48 = uVar7;
  local_40 = optmethod;
  local_38 = inp;
  if (cssml == 1) {
    local_58 = uVar6;
    local_3c = N;
    css(inp,N,optmethod,p,iVar8,q,phi,theta,wmean,var,resid,loglik,hess);
    as154_min.params._0_4_ = 0;
    as154_min.params._4_4_ = 0;
    iVar1 = checkroots_cerr(phi,&local_98,theta,&local_94,(double *)0x0,(int *)&as154_min.params,
                            (double *)0x0,(int *)((long)&as154_min.params + 4));
    if (iVar1 == 10) {
      return 10;
    }
    if (iVar1 == 0xc) {
      return 0xc;
    }
    local_68 = *wmean;
    uVar6 = local_58;
    pdVar3 = local_78;
    N = local_3c;
  }
  else {
    if (0 < p) {
      memset(phi,0,uVar6 << 3);
    }
    pdVar3 = local_78;
    local_68 = 0.0;
    if (0 < (int)local_48) {
      memset(theta,0,(local_48 & 0xffffffff) << 3);
    }
  }
  if (iVar8 < 1) {
    local_70 = (ulong)(uint)N;
    if (0 < N) {
      memcpy(pdVar3,local_38,(ulong)(uint)N << 3);
      local_70 = (ulong)(uint)N;
    }
  }
  else {
    uVar2 = diff(local_38,N,iVar8,pdVar3);
    local_70 = (ulong)uVar2;
  }
  iVar1 = (int)local_48;
  p_00 = (int)uVar6;
  if ((-iVar1 == p_00 && iVar8 == 0) && cssml == 1) {
    free(pdVar3);
    local_40 = 1;
  }
  else {
    local_80 = (long)(int)local_70;
    local_3c = N;
    if (iVar8 == 0) {
      pdVar3 = (double *)malloc(8);
      lVar9 = local_80;
      pdVar4 = (double *)malloc(local_80 * 8);
      obj = reg_init((int)lVar9,1);
      setIntercept(obj,1);
      regress(obj,(double *)0x0,local_78,pdVar4,pdVar3,0.95);
      local_68 = obj->beta[0].value;
      free(pdVar3);
      free(pdVar4);
      free_reg(obj);
      iVar1 = (int)local_48;
    }
    N_00 = (int)local_70;
    __ptr_01 = alik_init(p_00,iVar8,iVar1,N_00);
    __ptr_01->N = N_00;
    iVar8 = __ptr_01->pq;
    lVar9 = (long)iVar8;
    __size = lVar9 * 8;
    local_50 = (double *)malloc(__size);
    local_38 = (double *)malloc(__size);
    pdVar3 = (double *)malloc(__size * lVar9);
    pdVar4 = (double *)malloc(__size);
    ipiv = (int *)malloc(lVar9 * 4);
    if (0 < p_00) {
      memcpy(local_50,phi,(uVar6 & 0xffffffff) << 3);
    }
    uVar2 = local_40;
    __ptr = local_78;
    local_88 = (long)p_00;
    if (0 < (int)local_48) {
      uVar7 = 0;
      do {
        local_50[local_88 + uVar7] = -theta[uVar7];
        uVar7 = uVar7 + 1;
      } while ((local_48 & 0xffffffff) != uVar7);
    }
    if (__ptr_01->M == 1) {
      local_50[p_00 + (int)local_48] = local_68;
    }
    __ptr_01->mean = local_68;
    iVar1 = (int)local_70;
    if (0 < iVar1) {
      uVar7 = 0;
      do {
        dVar10 = local_78[uVar7];
        __ptr_01->x[(uint)(iVar1 * 2) + uVar7] = dVar10;
        __ptr_01->x[uVar7] = dVar10;
        uVar7 = uVar7 + 1;
      } while ((local_70 & 0xffffffff) != uVar7);
    }
    local_58 = uVar6;
    if (iVar1 < iVar1 * 2) {
      memset(__ptr_01->x + local_80,0,(ulong)(iVar1 - 1) * 8 + 8);
    }
    local_c0 = (undefined1  [8])fas154;
    as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr_01;
    local_40 = fminunc((custom_function *)local_c0,(custom_gradient *)0x0,iVar8,local_50,1.0,uVar2,
                       local_38);
    if ((0xf < local_40) || ((0x8011U >> (local_40 & 0x1f) & 1) == 0)) {
      local_40 = 1;
    }
    if (0 < iVar8) {
      lVar5 = 0;
      do {
        pdVar4[lVar5] = 1.0;
        lVar5 = lVar5 + 1;
      } while (lVar9 != lVar5);
    }
    if (0 < (int)local_48) {
      invertroot((int)local_48,local_38 + local_88);
    }
    hessian_fd((custom_function *)local_c0,local_38,iVar8,pdVar4,__ptr_01->eps,hess);
    mtranspose(hess,iVar8,iVar8,pdVar3);
    if (iVar8 != 0) {
      uVar6 = 0;
      do {
        pdVar3[uVar6] = (hess[uVar6] + pdVar3[uVar6]) * (double)local_5c * 0.5;
        uVar6 = uVar6 + 1;
      } while (iVar8 * iVar8 + (uint)(iVar8 * iVar8 == 0) != uVar6);
    }
    ludecomp(pdVar3,iVar8,ipiv);
    minverse(pdVar3,iVar8,ipiv,hess);
    __ptr_00 = local_38;
    if (0 < (int)local_58) {
      memcpy(phi,local_38,(local_58 & 0xffffffff) << 3);
    }
    if (0 < (int)local_48) {
      uVar6 = 0;
      do {
        theta[uVar6] = -__ptr_00[local_88 + uVar6];
        uVar6 = uVar6 + 1;
      } while ((local_48 & 0xffffffff) != uVar6);
    }
    dVar10 = 0.0;
    if (__ptr_01->M == 1) {
      dVar10 = __ptr_00[(int)local_48 + (int)local_58];
    }
    *wmean = dVar10;
    *var = __ptr_01->ssq / (double)(int)local_70;
    if (0 < local_5c) {
      memcpy(resid,__ptr_01->x + local_80,(ulong)(~(uint)_p_local + local_3c) * 8 + 8);
    }
    *loglik = __ptr_01->loglik;
    free(local_50);
    free(__ptr_00);
    free(__ptr);
    free(pdVar3);
    free(ipiv);
    free(pdVar4);
    free(__ptr_01);
  }
  return local_40;
}

Assistant:

int as154(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,
	double *resid,double *loglik,double *hess, int cssml) {
	int i,pq,retval,length,ret,rp,P,Q,ERR;
	double *b,*tf,*x,*dx,*thess,*varcovar,*res;
	int *ipiv;
	double maxstep,sigma,coeff;
	alik_object obj;
	reg_object fit;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;
	
	maxstep = 1.0;

	coeff = 0.0;
	sigma = 1.0;

	if (cssml == 1) {
		css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);
		P = 0;
		Q = 0;

		ERR = checkroots_cerr(phi, &p, theta, &q, NULL, &P, NULL, &Q);
		if (ERR == 10 || ERR == 12) return ERR;

		coeff = *wmean;
	}
	else {
		for (i = 0; i < p; ++i) phi[i] = 0.0;
		for (i = 0; i < q; ++i) theta[i] = 0.0;
	}


	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	if (p + q == 0 && d == 0 && cssml == 1) {
		free(x);
		//free_alik(obj);
		return 1;
	}

	if (d == 0) {
		rp = 1;
		varcovar = (double*)malloc(sizeof(double) * rp * rp);
		res = (double*)malloc(sizeof(double) * N);

		fit = reg_init(N, rp);

		setIntercept(fit, 1);
		regress(fit, NULL, x, res, varcovar, 0.95);

		
		coeff = (fit->beta + 0)->value;
		sigma = 10.0 * (fit->beta + 0)->stdErr;


		free(varcovar);
		free(res);
		free_reg(fit);
	}

	obj = alik_init(p, d, q, N);

	obj->N = N;
	
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = coeff;
	}

	obj->mean = coeff;


	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as154_min = { fas154, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	//Check for invertibility

	if (q > 0) {
		invertroot(q,tf+p);
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length-d) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
		wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) N;
	for (i = 0; i < length - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free_alik(obj);
	return ret;
}